

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char *pcVar9;
  char cVar10;
  bool bVar11;
  bool bVar12;
  char cVar13;
  uint32_t uVar14;
  SPIRType *pSVar15;
  undefined8 *puVar16;
  long *plVar17;
  SPIRVariable *pSVar18;
  SPIRType *pSVar19;
  runtime_error *this_00;
  ulong *puVar20;
  size_type *psVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  undefined8 uVar25;
  char (*ts_2) [2];
  SPIRType *pSVar26;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar27;
  undefined4 in_stack_fffffffffffffc28;
  ID id;
  string decl_type;
  uint local_3ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  char *overlapping_binding_tag;
  long local_380;
  ulong local_378;
  long lStack_370;
  string array_type;
  string __str_1;
  string pack_pfx;
  string __str;
  string base_type;
  uint *local_2b0;
  uint local_298 [8];
  bool *local_278;
  size_t local_270;
  bool local_260 [24];
  TypedID<(spirv_cross::Types)1> *local_248;
  size_t local_240;
  TypedID<(spirv_cross::Types)1> local_230 [8];
  uint *local_210;
  size_t local_208;
  uint local_1f8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1b8;
  SPIRType row_major_physical_type;
  
  bVar11 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  uVar14 = member_type_id;
  if (bVar11) {
    uVar14 = Compiler::get_extended_member_decoration
                       ((Compiler *)this,(type->super_IVariant).self.id,index,
                        SPIRVCrossDecorationPhysicalTypeID);
  }
  pSVar15 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar14);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar11 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationInterfaceOrigID);
  id.id = 0;
  if (bVar11) {
    id.id = Compiler::get_extended_member_decoration
                      ((Compiler *)this,(type->super_IVariant).self.id,index,
                       SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar11 = Compiler::is_matrix((Compiler *)this,pSVar15);
  bVar12 = false;
  if (bVar11) {
    bVar12 = Compiler::has_member_decoration
                       ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                        DecorationRowMajor);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.array.stack_storage;
  row_major_physical_type.super_IVariant.self.id = 0;
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
  row_major_physical_type.super_IVariant._12_4_ = 0x18;
  row_major_physical_type.basetype = Unknown;
  row_major_physical_type.width = 0;
  row_major_physical_type.vecsize = 1;
  row_major_physical_type.columns = 1;
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  row_major_physical_type.array.buffer_capacity = 8;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr =
       (bool *)&row_major_physical_type.array_size_literal.stack_storage;
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  row_major_physical_type.array_size_literal.buffer_capacity = 8;
  row_major_physical_type._120_8_ = (ulong)(ushort)row_major_physical_type._126_2_ << 0x30;
  row_major_physical_type.storage = Generic;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&row_major_physical_type.member_types.stack_storage;
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  row_major_physical_type.member_types.buffer_capacity = 8;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr =
       (uint *)&row_major_physical_type.member_type_index_redirection.stack_storage;
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  row_major_physical_type.member_type_index_redirection.buffer_capacity = 8;
  row_major_physical_type.member_name_cache._M_h._M_buckets =
       &row_major_physical_type.member_name_cache._M_h._M_single_bucket;
  row_major_physical_type.image._0_7_ = 0;
  row_major_physical_type.image._7_4_ = 0;
  row_major_physical_type.parent_type.id = 0;
  row_major_physical_type.image.sampled = 0;
  row_major_physical_type.image.format = ImageFormatUnknown;
  row_major_physical_type.image.access = AccessQualifierReadOnly;
  row_major_physical_type.type_alias.id = 0;
  row_major_physical_type.member_name_cache._M_h._M_bucket_count = 1;
  row_major_physical_type.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  row_major_physical_type.member_name_cache._M_h._M_element_count = 0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  row_major_physical_type.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  row_major_physical_type.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  bVar11 = Compiler::has_member_decoration
                     ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset
                     );
  if ((bVar11) ||
     (bVar11 = Compiler::has_extended_member_decoration
                         ((Compiler *)this,(type->super_IVariant).self.id,index,
                          SPIRVCrossDecorationResourceIndexPrimary), bVar11)) {
    this->is_using_builtin_array = true;
  }
  bVar11 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar26 = pSVar15;
  if (bVar11) {
    if (pSVar15->basetype == Struct) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Cannot emit a packed struct currently.");
      goto LAB_002b2787;
    }
    bVar11 = Compiler::is_matrix((Compiler *)this,pSVar15);
    if (!bVar11) {
      bVar11 = Compiler::is_scalar((Compiler *)this,pSVar15);
      if (!bVar11) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x413e31);
      }
      goto LAB_002b2187;
    }
    uVar14 = pSVar15->vecsize;
    local_3ac = pSVar15->columns;
    ::std::__cxx11::string::_M_replace
              ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x413e31);
    if (bVar12 != false) {
      local_3ac = pSVar15->vecsize;
      uVar14 = pSVar15->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x407662);
    }
    bVar11 = pSVar15->width == 0x10;
    pcVar9 = "snorm float";
    if (bVar11) {
      pcVar9 = "vload_half";
    }
    base_type._M_dataplus._M_p = (pointer)&base_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&base_type,pcVar9 + 6,pcVar9 + 6 + ((ulong)bVar11 ^ 5));
    array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&array_type,"typedef ","");
    ::std::operator+(&local_3a8,"packed_",&base_type);
    cVar13 = '\x01';
    if (9 < uVar14) {
      uVar24 = (ulong)uVar14;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        uVar22 = (uint)uVar24;
        if (uVar22 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002b1b4b;
        }
        if (uVar22 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002b1b4b;
        }
        if (uVar22 < 10000) goto LAB_002b1b4b;
        uVar24 = uVar24 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (99999 < uVar22);
      cVar13 = cVar13 + '\x01';
    }
LAB_002b1b4b:
    overlapping_binding_tag = (char *)&local_378;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_380,uVar14);
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar25 = local_3a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < local_380 + local_3a8._M_string_length) {
      uVar24 = 0xf;
      if ((ulong *)overlapping_binding_tag != &local_378) {
        uVar24 = local_378;
      }
      if (uVar24 < local_380 + local_3a8._M_string_length) goto LAB_002b1bb8;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&overlapping_binding_tag,0,(char *)0x0,
                           (ulong)local_3a8._M_dataplus._M_p);
    }
    else {
LAB_002b1bb8:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)overlapping_binding_tag)
      ;
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar21 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = puVar16[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*puVar16;
    }
    decl_type._M_string_length = puVar16[1];
    *puVar16 = psVar21;
    puVar16[1] = 0;
    *(char *)psVar21 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_378) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    ::std::operator+(&decl_type," ",&pack_pfx);
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    uVar22 = pSVar15->columns;
    cVar13 = '\x01';
    if (9 < uVar22) {
      uVar23 = uVar22;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar23 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002b1cf8;
        }
        if (uVar23 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002b1cf8;
        }
        if (uVar23 < 10000) goto LAB_002b1cf8;
        bVar11 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar11);
      cVar13 = cVar13 + '\x01';
    }
LAB_002b1cf8:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar22);
    plVar17 = (long *)::std::__cxx11::string::replace
                                ((ulong)&__str,0,(char *)0x0,(ulong)base_type._M_dataplus._M_p);
    overlapping_binding_tag = (char *)&local_378;
    puVar20 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar20) {
      local_378 = *puVar20;
      lStack_370 = plVar17[3];
    }
    else {
      local_378 = *puVar20;
      overlapping_binding_tag = (char *)*plVar17;
    }
    local_380 = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)::std::__cxx11::string::append((char *)&overlapping_binding_tag);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    puVar20 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_3a8.field_2._M_allocated_capacity = *puVar20;
      local_3a8.field_2._8_8_ = plVar17[3];
    }
    else {
      local_3a8.field_2._M_allocated_capacity = *puVar20;
      local_3a8._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_3a8._M_string_length = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    uVar22 = pSVar15->vecsize;
    cVar13 = '\x01';
    if (9 < uVar22) {
      uVar23 = uVar22;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar23 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002b1e40;
        }
        if (uVar23 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002b1e40;
        }
        if (uVar23 < 10000) goto LAB_002b1e40;
        bVar11 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar11);
      cVar13 = cVar13 + '\x01';
    }
LAB_002b1e40:
    paVar1 = &__str_1.field_2;
    __str_1._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar22);
    uVar24 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
             local_3a8._M_string_length;
    uVar25 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      uVar25 = local_3a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar25 < uVar24) {
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        uVar25 = __str_1.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar25 < uVar24) goto LAB_002b1ec4;
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&__str_1,0,(char *)0x0,(ulong)local_3a8._M_dataplus._M_p);
    }
    else {
LAB_002b1ec4:
      puVar16 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)&local_3a8,(ulong)__str_1._M_dataplus._M_p);
    }
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar21 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = puVar16[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*puVar16;
    }
    decl_type._M_string_length = puVar16[1];
    *puVar16 = psVar21;
    puVar16[1] = 0;
    *(char *)psVar21 = '\0';
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      operator_delete(__str_1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_378) {
      operator_delete(overlapping_binding_tag);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    cVar13 = '\x01';
    if (9 < local_3ac) {
      uVar22 = local_3ac;
      cVar10 = '\x04';
      do {
        cVar13 = cVar10;
        if (uVar22 < 100) {
          cVar13 = cVar13 + -2;
          goto LAB_002b1ff6;
        }
        if (uVar22 < 1000) {
          cVar13 = cVar13 + -1;
          goto LAB_002b1ff6;
        }
        if (uVar22 < 10000) goto LAB_002b1ff6;
        bVar11 = 99999 < uVar22;
        uVar22 = uVar22 / 10000;
        cVar10 = cVar13 + '\x04';
      } while (bVar11);
      cVar13 = cVar13 + '\x01';
    }
LAB_002b1ff6:
    overlapping_binding_tag = (char *)&local_378;
    ::std::__cxx11::string::_M_construct((ulong)&overlapping_binding_tag,cVar13);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (overlapping_binding_tag,(uint)local_380,local_3ac);
    plVar17 = (long *)::std::__cxx11::string::replace
                                ((ulong)&overlapping_binding_tag,0,(char *)0x0,0x3b5810);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    puVar20 = (ulong *)(plVar17 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar17 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar20) {
      local_3a8.field_2._M_allocated_capacity = *puVar20;
      local_3a8.field_2._8_8_ = plVar17[3];
    }
    else {
      local_3a8.field_2._M_allocated_capacity = *puVar20;
      local_3a8._M_dataplus._M_p = (pointer)*plVar17;
    }
    local_3a8._M_string_length = plVar17[1];
    *plVar17 = (long)puVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)::std::__cxx11::string::append((char *)&local_3a8);
    decl_type._M_dataplus._M_p = (pointer)&decl_type.field_2;
    psVar21 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar21) {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type.field_2._8_8_ = plVar17[3];
    }
    else {
      decl_type.field_2._M_allocated_capacity = *psVar21;
      decl_type._M_dataplus._M_p = (pointer)*plVar17;
    }
    decl_type._M_string_length = plVar17[1];
    *plVar17 = (long)psVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&array_type,(ulong)decl_type._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decl_type._M_dataplus._M_p != &decl_type.field_2) {
      operator_delete(decl_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((ulong *)overlapping_binding_tag != &local_378) {
      operator_delete(overlapping_binding_tag);
    }
    ::std::__cxx11::string::append((char *)&array_type);
    pVar27 = ::std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->typedef_lines,&array_type);
    if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Compiler::force_recompile((Compiler *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)array_type._M_dataplus._M_p != &array_type.field_2) {
      operator_delete(array_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    bVar11 = Compiler::is_matrix((Compiler *)this,pSVar15);
    if (bVar11) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar11 = Compiler::has_extended_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,
                              SPIRVCrossDecorationWorkgroupStruct), bVar11)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x407676);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if (bVar12 != false) {
        row_major_physical_type.super_IVariant.self.id = (pSVar15->super_IVariant).self.id;
        row_major_physical_type.columns = pSVar15->columns;
        row_major_physical_type._12_8_ = *(undefined8 *)&(pSVar15->super_IVariant).field_0xc;
        uVar2 = pSVar15->width;
        uVar3 = pSVar15->vecsize;
        row_major_physical_type.width = uVar2;
        row_major_physical_type.vecsize = uVar3;
        SmallVector<unsigned_int,_8UL>::operator=(&row_major_physical_type.array,&pSVar15->array);
        SmallVector<bool,_8UL>::operator=
                  (&row_major_physical_type.array_size_literal,&pSVar15->array_size_literal);
        row_major_physical_type.pointer_depth = pSVar15->pointer_depth;
        row_major_physical_type.pointer = pSVar15->pointer;
        row_major_physical_type.forward_pointer = pSVar15->forward_pointer;
        row_major_physical_type._126_2_ = *(undefined2 *)&pSVar15->field_0x7e;
        row_major_physical_type.storage = pSVar15->storage;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  (&row_major_physical_type.member_types,&pSVar15->member_types);
        SmallVector<unsigned_int,_8UL>::operator=
                  (&row_major_physical_type.member_type_index_redirection,
                   &pSVar15->member_type_index_redirection);
        uVar25._0_4_ = (pSVar15->image).type;
        uVar25._4_4_ = (pSVar15->image).dim;
        uVar4._0_1_ = (pSVar15->image).depth;
        uVar4._1_1_ = (pSVar15->image).arrayed;
        uVar4._2_1_ = (pSVar15->image).ms;
        uVar4._3_1_ = (pSVar15->image).field_0xb;
        uVar4._4_4_ = (pSVar15->image).sampled;
        uVar5 = (pSVar15->image).format;
        uVar6 = (pSVar15->image).access;
        uVar7 = pSVar15->type_alias;
        uVar8 = pSVar15->parent_type;
        row_major_physical_type.image._0_7_ = SUB87(uVar25,0);
        row_major_physical_type.image.dim._3_1_ = (undefined1)((uint)uVar25._4_4_ >> 0x18);
        row_major_physical_type.image._8_3_ = SUB83(uVar4,0);
        row_major_physical_type.image._11_1_ = uVar4._3_1_;
        row_major_physical_type.image.sampled = uVar4._4_4_;
        row_major_physical_type.image.format = uVar5;
        row_major_physical_type.image.access = uVar6;
        row_major_physical_type.type_alias.id = uVar7;
        row_major_physical_type.parent_type.id = uVar8;
        if (pSVar15 != &row_major_physical_type) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&row_major_physical_type.member_name_cache,
                     &(pSVar15->member_name_cache)._M_h);
        }
        uVar14 = row_major_physical_type.vecsize;
        row_major_physical_type.vecsize = row_major_physical_type.columns;
        row_major_physical_type.columns = uVar14;
        pSVar26 = &row_major_physical_type;
      }
    }
  }
LAB_002b2187:
  if ((((pSVar15->basetype == Image) && ((pSVar15->image).sampled == 2)) &&
      ((this->msl_options).platform == iOS)) &&
     (((int)(this->msl_options).argument_buffers_tier < 1 &&
      (bVar11 = Compiler::has_decoration((Compiler *)this,id,DecorationNonWritable), !bVar11)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"Writable images are not allowed on Tier1 argument buffers on iOS.");
LAB_002b2787:
    *(undefined ***)this_00 = &PTR__runtime_error_0050aef0;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (pSVar15->basetype - Image < 3) goto LAB_002b22d3;
  decl_type._M_dataplus._M_p._0_4_ = 0x7fffffff;
  uVar24 = (ulong)(this->stage_out_var_id).id;
  if (uVar24 == 0) {
LAB_002b222d:
    uVar24 = (ulong)(this->stage_in_var_id).id;
    if (uVar24 != 0) {
      pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar24);
      pSVar19 = Compiler::get_variable_data_type((Compiler *)this,pSVar18);
      if (((pSVar19->super_IVariant).self.id == (type->super_IVariant).self.id) &&
         (bVar11 = variable_storage_requires_stage_io(this,Input), bVar11)) goto LAB_002b2270;
    }
  }
  else {
    pSVar18 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar24);
    pSVar19 = Compiler::get_variable_data_type((Compiler *)this,pSVar18);
    if (((pSVar19->super_IVariant).self.id != (type->super_IVariant).self.id) ||
       ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_002b222d;
LAB_002b2270:
    bVar11 = Compiler::is_member_builtin((Compiler *)this,type,index,(BuiltIn *)&decl_type);
    if (bVar11) {
      this->is_using_builtin_array = true;
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
            (&base_type,this,pSVar15,(ulong)id.id);
  ::std::__cxx11::string::operator=((string *)&array_type,(string *)&base_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
LAB_002b22d3:
  if (id.id != 0) {
    bVar11 = Compiler::is_pointer((Compiler *)this,pSVar26);
    pSVar15 = pSVar26;
    if (bVar11) {
      pSVar15 = Compiler::get_pointee_type((Compiler *)this,pSVar26);
    }
    bVar11 = Compiler::is_array((Compiler *)this,pSVar15);
    if ((bVar11) && (uVar14 = get_resource_array_size(this,pSVar15,id.id), uVar14 == 0)) {
      ::std::__cxx11::string::_M_replace
                ((ulong)&array_type,0,(char *)array_type._M_string_length,0x4076c4);
    }
  }
  paVar1 = &decl_type.field_2;
  decl_type._M_string_length = 0;
  decl_type.field_2._M_allocated_capacity =
       decl_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
  decl_type._M_dataplus._M_p = (pointer)paVar1;
  if (pSVar26->vecsize < 5) {
    type_to_glsl_abi_cxx11_(&base_type,this,pSVar26,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&base_type);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)base_type._M_dataplus._M_p != &base_type.field_2) {
      operator_delete(base_type._M_dataplus._M_p);
    }
  }
  else {
    pSVar15 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
    SPIRType::SPIRType((SPIRType *)&base_type,pSVar15);
    bVar11 = Compiler::is_matrix((Compiler *)this,(SPIRType *)&base_type);
    if ((bVar12 & bVar11) == 1) {
      base_type.field_2._8_8_ = base_type.field_2._8_8_ >> 0x20;
    }
    base_type.field_2._12_4_ = 1;
    ts_2 = (char (*) [2])0x1;
    type_to_glsl_abi_cxx11_(&local_3a8,this,(SPIRType *)&base_type,id.id,true);
    ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if (pSVar26->columns < 2) {
      join<char_const(&)[17],std::__cxx11::string&,char_const(&)[2]>
                (&local_3a8,(spirv_cross *)"spvPaddedStd140<",(char (*) [17])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x408178,ts_2)
      ;
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3a8);
    }
    else {
      join<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                (&local_3a8,(spirv_cross *)"spvPaddedStd140Matrix<",(char (*) [23])&decl_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x407185,
                 (char (*) [3])&pSVar26->columns,(uint *)0x408178,
                 (char (*) [2])CONCAT44(id.id,in_stack_fffffffffffffc28));
      ::std::__cxx11::string::operator=((string *)&decl_type,(string *)&local_3a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    base_type._M_dataplus._M_p = "\x16\x19%";
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1b8);
    local_208 = 0;
    if (local_210 != local_1f8) {
      free(local_210);
    }
    local_240 = 0;
    if (local_248 != local_230) {
      free(local_248);
    }
    local_270 = 0;
    if (local_278 != local_260) {
      free(local_278);
    }
    if (local_2b0 != local_298) {
      free(local_2b0);
    }
  }
  bVar11 = Compiler::has_extended_member_decoration
                     ((Compiler *)this,(type->super_IVariant).self.id,index,
                      SPIRVCrossDecorationOverlappingBinding);
  overlapping_binding_tag = "";
  if (bVar11) {
    overlapping_binding_tag = "// Overlapping binding: ";
  }
  CompilerGLSL::to_member_name_abi_cxx11_(&base_type,&this->super_CompilerGLSL,type,index);
  member_attribute_qualifier_abi_cxx11_(&local_3a8,this,type,index);
  join<char_const*&,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&overlapping_binding_tag,(char **)&pack_pfx,
             &decl_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d8129,
             (char (*) [2])qualifier,&base_type,&local_3a8,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x414fcb,
             (char (*) [2])CONCAT44(id.id,in_stack_fffffffffffffc28));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_type._M_dataplus._M_p != &base_type.field_2) {
    operator_delete(base_type._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decl_type._M_dataplus._M_p != paVar1) {
    operator_delete(decl_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != &array_type.field_2) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  row_major_physical_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&row_major_physical_type.member_name_cache._M_h);
  row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size =
       0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.member_type_index_redirection.stack_storage) {
    free(row_major_physical_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  row_major_physical_type.member_types.
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      row_major_physical_type.member_types.
      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &row_major_physical_type.member_types.stack_storage) {
    free(row_major_physical_type.member_types.
         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  row_major_physical_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)
      row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr !=
      &row_major_physical_type.array_size_literal.stack_storage) {
    free(row_major_physical_type.array_size_literal.super_VectorView<bool>.ptr);
  }
  row_major_physical_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      row_major_physical_type.array.super_VectorView<unsigned_int>.ptr !=
      &row_major_physical_type.array.stack_storage) {
    free(row_major_physical_type.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	uint32_t orig_member_type_id = member_type_id;
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type { OpTypeMatrix };
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type, orig_id);
	}

	if (orig_id)
	{
		auto *data_type = declared_type;
		if (is_pointer(*data_type))
			data_type = &get_pointee_type(*data_type);

		if (is_array(*data_type) && get_resource_array_size(*data_type, orig_id) == 0)
		{
			// Hack for declaring unsized array of resources. Need to declare dummy sized array by value inline.
			// This can then be wrapped in spvDescriptorArray as usual.
			array_type = "[1] /* unsized array hack */";
		}
	}

	string decl_type;
	if (declared_type->vecsize > 4)
	{
		auto orig_type = get<SPIRType>(orig_member_type_id);
		if (is_matrix(orig_type) && row_major)
			swap(orig_type.vecsize, orig_type.columns);
		orig_type.columns = 1;
		decl_type = type_to_glsl(orig_type, orig_id, true);

		if (declared_type->columns > 1)
			decl_type = join("spvPaddedStd140Matrix<", decl_type, ", ", declared_type->columns, ">");
		else
			decl_type = join("spvPaddedStd140<", decl_type, ">");
	}
	else
		decl_type = type_to_glsl(*declared_type, orig_id, true);

	const char *overlapping_binding_tag =
			has_extended_member_decoration(type.self, index, SPIRVCrossDecorationOverlappingBinding) ?
			"// Overlapping binding: " : "";

	auto result = join(overlapping_binding_tag, pack_pfx, decl_type, " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}